

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemdelegate.cpp
# Opt level: O1

QRect __thiscall
QItemDelegate::doCheck
          (QItemDelegate *this,QStyleOptionViewItem *option,QRect *bounding,QVariant *value)

{
  QWidget *this_00;
  QStyle *pQVar1;
  long in_FS_OFFSET;
  QRect QVar2;
  QStyleOptionButton opt;
  undefined1 local_98 [16];
  undefined1 *local_88;
  undefined1 *puStack_80;
  undefined1 *local_78;
  QPalettePrivate *pQStack_70;
  undefined1 *local_68;
  QObject *pQStack_60;
  undefined1 *local_58;
  QArrayData *pQStack_50;
  char16_t *local_48;
  undefined1 *puStack_40;
  QIcon local_38;
  QSize QStack_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(ulong *)&(value->d).field_0x18 < 4) {
    QVar2 = (QRect)(ZEXT816(0xffffffffffffffff) << 0x40);
  }
  else {
    local_38.d = (QIconPrivate *)&DAT_aaaaaaaaaaaaaaaa;
    QStack_30 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
    local_48 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_50 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_60 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
    local_78 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_70 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
    local_88 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
    local_98._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_98._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QStyleOptionButton::QStyleOptionButton((QStyleOptionButton *)local_98);
    QStyleOption::operator=((QStyleOption *)local_98,&option->super_QStyleOption);
    local_88._0_4_ = (bounding->x1).m_i;
    local_88._4_4_ = (bounding->y1).m_i;
    puStack_80._0_4_ = (bounding->x2).m_i;
    puStack_80._4_4_ = (bounding->y2).m_i;
    this_00 = option->widget;
    if (this_00 == (QWidget *)0x0) {
      pQVar1 = QApplication::style();
    }
    else {
      pQVar1 = QWidget::style(this_00);
    }
    QVar2 = (QRect)(**(code **)(*(long *)pQVar1 + 0xc0))(pQVar1,0x17,local_98,this_00);
    QIcon::~QIcon(&local_38);
    if (pQStack_50 != (QArrayData *)0x0) {
      LOCK();
      (pQStack_50->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQStack_50->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQStack_50->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQStack_50,2,0x10);
      }
    }
    QStyleOption::~QStyleOption((QStyleOption *)local_98);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return QVar2;
  }
  __stack_chk_fail();
}

Assistant:

QRect QItemDelegate::doCheck(const QStyleOptionViewItem &option,
                           const QRect &bounding, const QVariant &value) const
{
    if (value.isValid()) {
        Q_D(const QItemDelegate);
        QStyleOptionButton opt;
        opt.QStyleOption::operator=(option);
        opt.rect = bounding;
        const QWidget *widget = d->widget(option); // cast
        QStyle *style = widget ? widget->style() : QApplication::style();
        return style->subElementRect(QStyle::SE_ItemViewItemCheckIndicator, &opt, widget);
    }
    return QRect();
}